

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O2

RTCGeometry rtcGetGeometryThreadSafe(RTCScene hscene,uint geomID)

{
  RTCGeometry pRVar1;
  Lock<embree::MutexSys> lock;
  
  lock.mutex = (MutexSys *)(hscene + 0x248);
  lock.locked = true;
  embree::MutexSys::lock(lock.mutex);
  pRVar1 = *(RTCGeometry *)(*(long *)(hscene + 0x1e8) + (ulong)geomID * 8);
  if (pRVar1 == (RTCGeometry)0x0) {
    embree::Lock<embree::MutexSys>::~Lock(&lock);
    pRVar1 = (RTCGeometry)0x0;
  }
  else {
    (**(code **)(*(long *)pRVar1 + 0x10))(pRVar1);
    embree::Lock<embree::MutexSys>::~Lock(&lock);
    (**(code **)(*(long *)pRVar1 + 0x18))(pRVar1);
  }
  return pRVar1;
}

Assistant:

RTC_API RTCGeometry rtcGetGeometryThreadSafe (RTCScene hscene, unsigned int geomID)
  {
    Scene* scene = (Scene*) hscene;
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcGetGeometryThreadSafe);
#if defined(DEBUG)
    RTC_VERIFY_HANDLE(hscene);
    RTC_VERIFY_GEOMID(geomID);
#endif
    Ref<Geometry> geom = scene->get_locked(geomID);
    return (RTCGeometry) geom.ptr; 
    RTC_CATCH_END2(scene);
    return nullptr;
  }